

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

size_t __thiscall CFG::anon_unknown_11::Optimizer::Hash(Optimizer *this,Block *Curr)

{
  bool bVar1;
  size_t sVar2;
  InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *this_00;
  type local_60;
  type *local_58;
  type *CurrBranch;
  type *CurrBlock;
  _Self local_40;
  iterator __end2;
  iterator __begin2;
  BlockBranchMap *__range2;
  size_t local_20;
  size_t digest;
  Block *Curr_local;
  Optimizer *this_local;
  
  digest = (size_t)Curr;
  Curr_local = (Block *)this;
  local_20 = ::wasm::ExpressionAnalyzer::hash(Curr->Code);
  __range2._7_1_ = 1;
  ::wasm::rehash<unsigned_char>(&local_20,(uchar *)((long)&__range2 + 7));
  if (*(long *)(digest + 0x160) != 0) {
    sVar2 = ::wasm::ExpressionAnalyzer::hash(*(Expression **)(digest + 0x160));
    ::wasm::hash_combine(&local_20,sVar2);
  }
  __range2._6_1_ = 2;
  ::wasm::rehash<unsigned_char>(&local_20,(uchar *)((long)&__range2 + 6));
  this_00 = (InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *)(digest + 8);
  __end2 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(this_00);
  local_40._M_node =
       (_List_node_base *)::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,&local_40);
    if (!bVar1) break;
    CurrBlock = &std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*
                           (&__end2)->first;
    CurrBranch = (type *)std::get<0ul,CFG::Block*const,CFG::Branch*>
                                   ((pair<CFG::Block_*const,_CFG::Branch_*> *)CurrBlock);
    local_58 = std::get<1ul,CFG::Block*const,CFG::Branch*>
                         ((pair<CFG::Block_*const,_CFG::Branch_*> *)CurrBlock);
    local_60 = *CurrBranch;
    ::wasm::rehash<unsigned_long>(&local_20,(unsigned_long *)&local_60);
    sVar2 = Hash(this,*local_58);
    ::wasm::hash_combine(&local_20,sVar2);
    std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end2);
  }
  return local_20;
}

Assistant:

size_t Hash(Block* Curr) {
    auto digest = wasm::ExpressionAnalyzer::hash(Curr->Code);
    wasm::rehash(digest, uint8_t(1));
    if (Curr->SwitchCondition) {
      wasm::hash_combine(digest,
                         wasm::ExpressionAnalyzer::hash(Curr->SwitchCondition));
    }
    wasm::rehash(digest, uint8_t(2));
    for (auto& [CurrBlock, CurrBranch] : Curr->BranchesOut) {
      // Hash the Block* as a pointer TODO: full hash?
      wasm::rehash(digest, reinterpret_cast<size_t>(CurrBlock));
      // Hash the Branch info properly
      wasm::hash_combine(digest, Hash(CurrBranch));
    }
    return digest;
  }